

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

intptr_t fiobj_data_pos(FIOBJ io)

{
  size_t sVar1;
  FIOBJ io_local;
  
  if ((io != 0) && (sVar1 = fiobj_type_is(io,FIOBJ_T_DATA), sVar1 != 0)) {
    if (0xfffffffd < *(uint *)(io + 0x30)) {
      return *(intptr_t *)(io + 0x28);
    }
    return *(intptr_t *)(io + 0x10);
  }
  return -1;
}

Assistant:

intptr_t fiobj_data_pos(FIOBJ io) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA))
    return -1;
  switch (obj2io(io)->fd) {
  case -1: /* fallthrough */
  case -2:
    return obj2io(io)->pos;
    break;
  default:
    return obj2io(io)->source.fpos;
  }
}